

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::Brick_Mass::Evaluate
          (Brick_Mass *this,ChMatrixNM<double,_24,_24> *result,double x,double y,double z)

{
  ChMatrixNM<double,_3,_24> *this_00;
  ShapeVector *this_01;
  Scalar SVar1;
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  Scalar *pSVar4;
  long col;
  int i;
  long index;
  undefined1 auVar5 [16];
  double x_00;
  Scalar SVar6;
  double y_00;
  ChMatrixNM<double,_3,_24> *local_e0;
  double factor;
  undefined1 local_d0 [16];
  scalar_constant_op<double> local_c0;
  RhsNested local_b8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> local_a8;
  ChMatrixNM<double,_3,_3> rd0;
  
  this_01 = &this->N;
  x_00 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,this_01,x,y,z);
  y_00 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,x_00,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,y_00,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ(this->element,&this->Nz,x,y,z);
  this_00 = &this->S;
  col = 0;
  for (index = 0; index != 8; index = index + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)this_01,index);
    SVar1 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)this_00,0,col)
    ;
    *pSVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)this_01,index);
    SVar1 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)this_00,1,
                        col + 1);
    *pSVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)this_01,index);
    SVar1 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_1> *)this_00,2,
                        col + 2);
    col = col + 3;
    *pSVar4 = SVar1;
  }
  local_d0._0_8_ = this->d0;
  local_d0._8_8_ = &this->Nx;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_d0);
  local_d0._0_8_ = this->d0;
  local_d0._8_8_ = &this->Ny;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_d0);
  local_d0._0_8_ = this->d0;
  local_d0._8_8_ = &this->Nz;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
              *)local_d0);
  SVar6 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run(&rd0);
  auVar2._8_8_ = 0x3fe0000000000000;
  auVar2._0_8_ = 0x3fe0000000000000;
  auVar5 = vmulpd_avx512vl(*(undefined1 (*) [16])((this->element->m_InertFlexVec).m_data + 1),auVar2
                          );
  auVar2 = vshufpd_avx(auVar5,auVar5,1);
  factor = SVar6 * (this->element->m_InertFlexVec).m_data[0] * 0.5 * auVar5._0_8_ * auVar2._0_8_;
  local_e0 = this_00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
                    *)local_d0,&factor,(StorageBaseType *)&local_e0);
  local_a8.m_xpr = (XprTypeNested)local_c0.m_other;
  local_a8.m_startRow.m_value = (long)local_b8.m_matrix;
  local_a8.m_outerStride = (Index)this_00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,0>>
            (result,(Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>
                     *)&local_a8);
  return;
}

Assistant:

void Brick_Mass::Evaluate(ChMatrixNM<double, 24, 24>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // S=[N1*eye(3) N2*eye(3) N3*eye(3) N4*eye(3)...]
    for (int i = 0; i < 8; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    // Perform  r = S'*S
    double factor = detJ0 * (element->GetLengthX() / 2) * (element->GetLengthY() / 2) * (element->GetLengthZ() / 2);
    result = factor * S.transpose() * S;
}